

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void monty_import_into(MontyContext *mc,mp_int *r,mp_int *x)

{
  mp_int *src;
  
  src = monty_import(mc,x);
  mp_copy_into(r,src);
  mp_free(src);
  return;
}

Assistant:

void monty_import_into(MontyContext *mc, mp_int *r, mp_int *x)
{
    mp_int *imported = monty_import(mc, x);
    mp_copy_into(r, imported);
    mp_free(imported);
}